

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::SIVTest
          (LoopDependenceAnalysis *this,
          pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *subscript_pair,
          DistanceVector *distance_vector)

{
  SENode *node;
  SENode *node_00;
  SERecurrentNode *pSVar1;
  SERecurrentNode *pSVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  DistanceEntry *distance_entry;
  int64_t iVar6;
  int64_t iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SENode *pSVar8;
  SENode *pSVar9;
  char *pcVar10;
  string *psVar11;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  source_recurrent_nodes;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  destination_recurrent_nodes;
  allocator<char> local_1a9;
  SERecurrentNode *local_1a8;
  _Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  local_1a0;
  _Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  local_188;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  distance_entry = GetDistanceEntryForSubscriptPair(this,subscript_pair,distance_vector);
  if (distance_entry == (DistanceEntry *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,
               "SIVTest could not find a DistanceEntry for subscript_pair. Exiting",
               (allocator<char> *)&local_1a0);
    PrintDebug(this,&local_50);
    std::__cxx11::string::_M_dispose();
  }
  node = subscript_pair->first;
  node_00 = subscript_pair->second;
  iVar6 = CountInductionVariables(this,node);
  iVar7 = CountInductionVariables(this,node_00);
  if (iVar6 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Found source has no induction variable.",
               (allocator<char> *)&local_1a0);
    PrintDebug(this,&local_70);
    std::__cxx11::string::_M_dispose();
    iVar4 = (*node_00->_vptr_SENode[6])(node_00);
    iVar5 = (*node_00->_vptr_SENode[6])(node_00);
    bVar3 = WeakZeroSourceSIVTest
                      (this,node,(SERecurrentNode *)CONCAT44(extraout_var,iVar4),
                       *(SENode **)(CONCAT44(extraout_var_00,iVar5) + 0x30),distance_entry);
    if (bVar3) {
      pcVar10 = "Proved independence with WeakZeroSourceSIVTest.";
      psVar11 = &local_90;
      goto LAB_0050032a;
    }
  }
  if (iVar7 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"Found destination has no induction variable.",
               (allocator<char> *)&local_1a0);
    PrintDebug(this,&local_b0);
    std::__cxx11::string::_M_dispose();
    iVar4 = (*node->_vptr_SENode[6])(node);
    iVar5 = (*node->_vptr_SENode[6])(node);
    bVar3 = WeakZeroDestinationSIVTest
                      (this,(SERecurrentNode *)CONCAT44(extraout_var_01,iVar4),node_00,
                       *(SENode **)(CONCAT44(extraout_var_02,iVar5) + 0x30),distance_entry);
    if (bVar3) {
      pcVar10 = "Proved independence with WeakZeroDestinationSIVTest.";
      psVar11 = &local_d0;
LAB_0050032a:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)psVar11,pcVar10,(allocator<char> *)&local_1a0);
      PrintDebug(this,psVar11);
      std::__cxx11::string::_M_dispose();
      distance_entry->dependence_information = DIRECTION;
      distance_entry->direction = NONE;
      return true;
    }
  }
  SENode::CollectRecurrentNodes
            ((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
              *)&local_1a0,node);
  SENode::CollectRecurrentNodes
            ((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
              *)&local_188,node_00);
  if (((long)local_1a0._M_impl.super__Vector_impl_data._M_finish -
       (long)local_1a0._M_impl.super__Vector_impl_data._M_start == 8) &&
     ((long)local_188._M_impl.super__Vector_impl_data._M_finish -
      (long)local_188._M_impl.super__Vector_impl_data._M_start == 8)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"Found source and destination have 1 induction variable.",
               &local_1a9);
    PrintDebug(this,&local_f0);
    std::__cxx11::string::_M_dispose();
    local_1a8 = *local_1a0._M_impl.super__Vector_impl_data._M_start;
    pSVar1 = *local_188._M_impl.super__Vector_impl_data._M_start;
    pSVar9 = local_1a8->coefficient_;
    pSVar8 = pSVar1->coefficient_;
    if (pSVar9 == pSVar8) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"Found source and destination share coefficient.",&local_1a9);
      PrintDebug(this,&local_110);
      std::__cxx11::string::_M_dispose();
      pSVar2 = local_1a8;
      bVar3 = StrongSIVTest(this,node,node_00,local_1a8->coefficient_,distance_entry);
      if (!bVar3) {
        pSVar9 = pSVar2->coefficient_;
        pSVar8 = pSVar1->coefficient_;
        goto LAB_00500452;
      }
      pcVar10 = "Proved independence with StrongSIVTest";
      psVar11 = &local_130;
LAB_005004ba:
      std::__cxx11::string::string<std::allocator<char>>((string *)psVar11,pcVar10,&local_1a9);
      PrintDebug(this,psVar11);
      std::__cxx11::string::_M_dispose();
      distance_entry->dependence_information = DIRECTION;
      distance_entry->direction = NONE;
      bVar3 = true;
      goto LAB_005004e7;
    }
LAB_00500452:
    pSVar8 = ScalarEvolutionAnalysis::CreateNegation(&this->scalar_evolution_,pSVar8);
    if (pSVar9 == pSVar8) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"Found source coefficient = -destination coefficient.",
                 &local_1a9);
      PrintDebug(this,&local_150);
      std::__cxx11::string::_M_dispose();
      bVar3 = WeakCrossingSIVTest(this,node,node_00,local_1a8->coefficient_,distance_entry);
      if (bVar3) {
        pcVar10 = "Proved independence with WeakCrossingSIVTest";
        psVar11 = &local_170;
        goto LAB_005004ba;
      }
    }
  }
  bVar3 = false;
LAB_005004e7:
  std::
  _Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  ::~_Vector_base(&local_188);
  std::
  _Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  ::~_Vector_base(&local_1a0);
  return bVar3;
}

Assistant:

bool LoopDependenceAnalysis::SIVTest(
    const std::pair<SENode*, SENode*>& subscript_pair,
    DistanceVector* distance_vector) {
  DistanceEntry* distance_entry =
      GetDistanceEntryForSubscriptPair(subscript_pair, distance_vector);
  if (!distance_entry) {
    PrintDebug(
        "SIVTest could not find a DistanceEntry for subscript_pair. Exiting");
  }

  SENode* source_node = std::get<0>(subscript_pair);
  SENode* destination_node = std::get<1>(subscript_pair);

  int64_t source_induction_count = CountInductionVariables(source_node);
  int64_t destination_induction_count =
      CountInductionVariables(destination_node);

  // If the source node has no induction variables we can apply a
  // WeakZeroSrcTest.
  if (source_induction_count == 0) {
    PrintDebug("Found source has no induction variable.");
    if (WeakZeroSourceSIVTest(
            source_node, destination_node->AsSERecurrentNode(),
            destination_node->AsSERecurrentNode()->GetCoefficient(),
            distance_entry)) {
      PrintDebug("Proved independence with WeakZeroSourceSIVTest.");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::DIRECTION;
      distance_entry->direction = DistanceEntry::Directions::NONE;
      return true;
    }
  }

  // If the destination has no induction variables we can apply a
  // WeakZeroDestTest.
  if (destination_induction_count == 0) {
    PrintDebug("Found destination has no induction variable.");
    if (WeakZeroDestinationSIVTest(
            source_node->AsSERecurrentNode(), destination_node,
            source_node->AsSERecurrentNode()->GetCoefficient(),
            distance_entry)) {
      PrintDebug("Proved independence with WeakZeroDestinationSIVTest.");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::DIRECTION;
      distance_entry->direction = DistanceEntry::Directions::NONE;
      return true;
    }
  }

  // We now need to collect the SERecurrentExpr nodes from source and
  // destination. We do not handle cases where source or destination have
  // multiple SERecurrentExpr nodes.
  std::vector<SERecurrentNode*> source_recurrent_nodes =
      source_node->CollectRecurrentNodes();
  std::vector<SERecurrentNode*> destination_recurrent_nodes =
      destination_node->CollectRecurrentNodes();

  if (source_recurrent_nodes.size() == 1 &&
      destination_recurrent_nodes.size() == 1) {
    PrintDebug("Found source and destination have 1 induction variable.");
    SERecurrentNode* source_recurrent_expr = *source_recurrent_nodes.begin();
    SERecurrentNode* destination_recurrent_expr =
        *destination_recurrent_nodes.begin();

    // If the coefficients are identical we can apply a StrongSIVTest.
    if (source_recurrent_expr->GetCoefficient() ==
        destination_recurrent_expr->GetCoefficient()) {
      PrintDebug("Found source and destination share coefficient.");
      if (StrongSIVTest(source_node, destination_node,
                        source_recurrent_expr->GetCoefficient(),
                        distance_entry)) {
        PrintDebug("Proved independence with StrongSIVTest");
        distance_entry->dependence_information =
            DistanceEntry::DependenceInformation::DIRECTION;
        distance_entry->direction = DistanceEntry::Directions::NONE;
        return true;
      }
    }

    // If the coefficients are of equal magnitude and opposite sign we can
    // apply a WeakCrossingSIVTest.
    if (source_recurrent_expr->GetCoefficient() ==
        scalar_evolution_.CreateNegation(
            destination_recurrent_expr->GetCoefficient())) {
      PrintDebug("Found source coefficient = -destination coefficient.");
      if (WeakCrossingSIVTest(source_node, destination_node,
                              source_recurrent_expr->GetCoefficient(),
                              distance_entry)) {
        PrintDebug("Proved independence with WeakCrossingSIVTest");
        distance_entry->dependence_information =
            DistanceEntry::DependenceInformation::DIRECTION;
        distance_entry->direction = DistanceEntry::Directions::NONE;
        return true;
      }
    }
  }

  return false;
}